

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_iterator.hpp
# Opt level: O0

bool __thiscall
boost::unit_test::utils::ut_detail::
delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>::operator()
          (delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_> *this
          ,char c)

{
  static_any_base *psVar1;
  bool bVar2;
  int iVar3;
  char in_SIL;
  basic_cstring<const_char> *in_RDI;
  char delim;
  bool _fe_con_104;
  static_any_t _fe_end_104;
  static_any_t _fe_cur_104;
  static_any_base *in_stack_ffffffffffffff78;
  static_any_base *psVar4;
  char *local_40;
  static_any_base *local_38;
  char *local_28;
  static_any_base *local_20;
  bool local_1;
  
  switch(*(undefined4 *)&in_RDI[1].m_begin) {
  case 0:
    for_each::is_const_coll<boost::unit_test::basic_cstring<char_const>>(in_RDI);
    integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x28a008);
    local_28 = (char *)for_each::begin<boost::unit_test::basic_cstring<char_const>>(in_RDI);
    local_20 = (static_any_base *)&local_28;
    bVar2 = for_each::static_any_base::operator_cast_to_bool(local_20);
    if (!bVar2) {
      for_each::is_const_coll<boost::unit_test::basic_cstring<char_const>>(in_RDI);
      integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x28a04a);
      local_40 = (char *)for_each::end<boost::unit_test::basic_cstring<char_const>>(in_RDI);
      local_38 = (static_any_base *)&local_40;
      bVar2 = for_each::static_any_base::operator_cast_to_bool(local_38);
      if (!bVar2) {
        while( true ) {
          psVar1 = local_20;
          psVar4 = local_38;
          for_each::is_const_coll<boost::unit_test::basic_cstring<char_const>>(in_RDI);
          integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x28a0b2);
          bVar2 = for_each::done<boost::unit_test::basic_cstring<char_const>>(psVar1,psVar4,in_RDI);
          if (((bVar2 ^ 0xffU) & 1) == 0) break;
          psVar4 = local_20;
          for_each::is_const_coll<boost::unit_test::basic_cstring<char_const>>(in_RDI);
          integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x28a106);
          for_each::deref<char,boost::unit_test::basic_cstring<char_const>>(psVar4,in_RDI);
          bVar2 = false;
          while (!bVar2) {
            bVar2 = default_char_compare<char>::operator()
                              ((default_char_compare<char> *)psVar4,
                               (char)((ulong)in_stack_ffffffffffffff78 >> 0x38),
                               (char)((ulong)in_stack_ffffffffffffff78 >> 0x30));
            if (bVar2) {
              return true;
            }
            bVar2 = true;
          }
          in_stack_ffffffffffffff78 = local_20;
          for_each::is_const_coll<boost::unit_test::basic_cstring<char_const>>(in_RDI);
          integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x28a17f);
          for_each::next<boost::unit_test::basic_cstring<char_const>>
                    (in_stack_ffffffffffffff78,in_RDI);
        }
      }
    }
    local_1 = false;
    break;
  case 1:
    iVar3 = ispunct((int)in_SIL);
    local_1 = iVar3 != 0;
    break;
  case 2:
    iVar3 = isspace((int)in_SIL);
    local_1 = iVar3 != 0;
    break;
  case 3:
    local_1 = false;
    break;
  default:
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool        operator()( CharT c )
    {
        switch( m_type ) {
        case dt_char: {
            BOOST_TEST_FOREACH( CharT, delim, m_delimeters )
                if( CharCompare()( delim, c ) )
                    return true;

            return false;
        }
        case dt_ispunct:
            return (std::ispunct)( c ) != 0;
        case dt_isspace:
            return (std::isspace)( c ) != 0;
        case dt_none:
            return false;
        }

        return false;
    }